

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O0

int __thiscall PosixSerialPort::get(PosixSerialPort *this)

{
  int iVar1;
  byte local_19;
  PosixSerialPort *pPStack_18;
  uint8_t byte;
  PosixSerialPort *this_local;
  
  if (this->_devfd == -1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    pPStack_18 = this;
    iVar1 = (*(this->super_SerialPort)._vptr_SerialPort[5])(this,&local_19,1);
    if (iVar1 == 1) {
      this_local._4_4_ = (uint)local_19;
    }
    else {
      this_local._4_4_ = 0xffffffff;
    }
  }
  return this_local._4_4_;
}

Assistant:

int
PosixSerialPort::get()
{
    uint8_t byte;

    if (_devfd == -1)
        return -1;

    if (read(&byte, 1) != 1)
        return -1;

    return byte;
}